

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O3

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
astar::astar_path(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                  *__return_storage_ptr__,astar *this,
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *map)

{
  pointer *pppVar1;
  double total_cost;
  iterator iVar2;
  double g_cost;
  int p;
  uint y;
  int iVar3;
  ulong uVar4;
  uint k;
  int iVar5;
  pointer piVar6;
  long lVar7;
  uint x;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  undefined1 local_168 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  open;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  visited;
  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_> temp_list;
  undefined1 local_110 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  parentDir;
  vector<int,_std::allocator<int>_> moveX;
  vector<int,_std::allocator<int>_> moveY;
  undefined1 auStack_b8 [8];
  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_> open_list;
  undefined1 local_90 [8];
  nodes child;
  nodes current;
  undefined1 auStack_58 [8];
  nodes start;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  open_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  open_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  visited.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_58 = (undefined1  [8])operator_new(0xc80);
  piVar6 = (pointer)((long)auStack_58 + 0xc80);
  start.g_cost_ = (double)piVar6;
  memset((void *)auStack_58,0,0xc80);
  start._0_8_ = piVar6;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_168,800,(value_type *)auStack_58,
           (allocator_type *)
           &open.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,(long)start.g_cost_ - (long)auStack_58);
  }
  auStack_58 = (undefined1  [8])0x0;
  start.x_ = 0;
  start.y_ = 0;
  start.g_cost_ = 0.0;
  auStack_58 = (undefined1  [8])operator_new(0xc80);
  piVar6 = (pointer)((long)auStack_58 + 0xc80);
  start.g_cost_ = (double)piVar6;
  memset((void *)auStack_58,0,0xc80);
  start._0_8_ = piVar6;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&open.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,800,(value_type *)auStack_58,
           (allocator_type *)local_110);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,(long)start.g_cost_ - (long)auStack_58);
  }
  auStack_58 = (undefined1  [8])0x0;
  start.x_ = 0;
  start.y_ = 0;
  start.g_cost_ = 0.0;
  auStack_58 = (undefined1  [8])operator_new(0xc80);
  piVar6 = (pointer)((long)auStack_58 + 0xc80);
  start.g_cost_ = (double)piVar6;
  memset((void *)auStack_58,0,0xc80);
  start._0_8_ = piVar6;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_110,800,(value_type *)auStack_58,
           (allocator_type *)
           &parentDir.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,(long)start.g_cost_ - (long)auStack_58);
  }
  start.g_cost_ = -NAN;
  start.f_cost_ = 2.12199579096527e-314;
  auStack_58 = (undefined1  [8])0x100000001;
  start.x_ = 0;
  start.y_ = -1;
  __l._M_len = 8;
  __l._M_array = (iterator)auStack_58;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &parentDir.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l,
             (allocator_type *)
             &moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  start.g_cost_ = -NAN;
  start.f_cost_ = -NAN;
  auStack_58 = (undefined1  [8])0x100000000;
  start.x_ = 1;
  start.y_ = 1;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)auStack_58;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__l_00,(allocator_type *)&child.f_cost_);
  nodes::nodes((nodes *)auStack_58,this->x_start_,this->y_start_,0.0,0.0);
  start.g_cost_ = nodes::compute_f((nodes *)auStack_58,this->x_goal_,this->y_goal_);
  std::priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>::push
            ((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
              *)auStack_b8,(value_type *)auStack_58);
  (((pointer)((long)local_168 + (long)(int)auStack_58._0_4_ * 0x18))->
  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [(int)auStack_58._4_4_] = (int)start.g_cost_;
  if (auStack_b8 !=
      (undefined1  [8])
      open_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    do {
      total_cost = *(double *)((long)auStack_b8 + 0x10);
      child.f_cost_ = *(double *)auStack_b8;
      g_cost = *(double *)((long)auStack_b8 + 8);
      std::priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>::
      pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_> *
          )auStack_b8);
      (((pointer)((long)local_168 + (long)child.f_cost_._0_4_ * 0x18))->
      super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      [child.f_cost_._4_4_] = 0;
      open.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage[child.f_cost_._0_4_].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [child.f_cost_._4_4_] = 1;
      if ((child.f_cost_._0_4_ == this->x_goal_) &&
         (iVar3 = child.f_cost_._0_4_, iVar5 = child.f_cost_._4_4_,
         child.f_cost_._4_4_ == this->y_goal_)) goto LAB_0011ead7;
      lVar7 = 0;
      do {
        x = *(int *)((long)&((parentDir.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar7 * 4) + child.f_cost_._0_4_;
        if (x < 800) {
          y = moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage[lVar7] + child.f_cost_._4_4_;
          if (y < 800) {
            uVar4 = (ulong)y;
            if ((*(int *)(*(long *)&(map->
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[x].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + uVar4 * 4) != 0) &&
               (open.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[x].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar4] != 1)) {
              nodes::nodes((nodes *)local_90,x,y,g_cost,total_cost);
              k = (uint)lVar7;
              child._0_8_ = nodes::compute_g((nodes *)local_90,k);
              child.g_cost_ = nodes::compute_f((nodes *)local_90,this->x_goal_,this->y_goal_);
              piVar6 = (((pointer)((long)local_168 + (ulong)x * 0x18))->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if (piVar6[uVar4] == 0) {
                piVar6[uVar4] = (int)child.g_cost_;
                std::
                priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                        *)auStack_b8,(value_type *)local_90);
                (((pointer)((long)local_110 + (ulong)x * 0x18))->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start[uVar4] = k ^ 4;
              }
              else if (child.g_cost_ < (double)piVar6[uVar4]) {
                piVar6[uVar4] = (int)child.g_cost_;
                (((pointer)((long)local_110 + (ulong)x * 0x18))->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start[uVar4] = k ^ 4;
                while ((*(int *)auStack_b8 != x || (*(int *)((long)auStack_b8 + 4) != y))) {
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                          *)&visited.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (value_type *)auStack_b8);
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                         *)auStack_b8);
                }
                std::
                priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                ::pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                       *)auStack_b8);
                while (visited.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                          *)auStack_b8,
                         (value_type *)
                         visited.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                         *)&visited.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                std::
                priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                        *)auStack_b8,(value_type *)local_90);
              }
              nodes::~nodes((nodes *)local_90);
            }
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 8);
      nodes::~nodes((nodes *)&child.f_cost_);
    } while (auStack_b8 !=
             (undefined1  [8])
             open_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Path not found.",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  child.f_cost_ = -NAN;
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    _M_realloc_insert<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,iVar2,(pair<int,_int> *)&child.f_cost_);
  }
  else {
    (iVar2._M_current)->first = -1;
    (iVar2._M_current)->second = -1;
    pppVar1 = &(__return_storage_ptr__->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
LAB_0011eafa:
  nodes::~nodes((nodes *)auStack_58);
  if (moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)moveY.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (parentDir.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(parentDir.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)parentDir.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_110);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&open.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_168);
  std::vector<nodes,_std::allocator<nodes>_>::~vector
            ((vector<nodes,_std::allocator<nodes>_> *)
             &visited.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<nodes,_std::allocator<nodes>_>::~vector
            ((vector<nodes,_std::allocator<nodes>_> *)auStack_b8);
  return __return_storage_ptr__;
LAB_0011ead7:
  for (; (iVar3 != this->x_start_ || (iVar5 != this->y_start_));
      iVar5 = iVar5 + moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[lVar7]) {
    lVar7 = (long)(((pointer)((long)local_110 + (long)iVar3 * 0x18))->
                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                  _M_start[iVar5];
    local_90._4_4_ = iVar5;
    local_90._0_4_ = iVar3;
    iVar2._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      _M_realloc_insert<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 __return_storage_ptr__,iVar2,(pair<int,_int> *)local_90);
    }
    else {
      *iVar2._M_current = (pair<int,_int>)local_90;
      pppVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    iVar3 = iVar3 + *(int *)((long)&((parentDir.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar7 * 4);
  }
  nodes::~nodes((nodes *)&child.f_cost_);
  goto LAB_0011eafa;
}

Assistant:

std::vector<std::pair<int, int>> astar::astar_path(
                                std::vector<std::vector<int>> map) {
    int neighbours = 8;  // max no of possible neighbors for any node

    std::vector<std::pair<int, int>> path;
    // Create a priority list of open nodes
    std::priority_queue<nodes, std::vector<nodes>,
                        std::greater<nodes>> open_list;
    // Create a priority list to store temporary nodes
    std::priority_queue<nodes, std::vector<nodes>,
                          std::greater<nodes>> temp_list;
    // Create 2D vectors to store open and visited nodes.
    std::vector<std::vector<int> > open(800, std::vector<int>(800, 0));
    std::vector<std::vector<int> > visited(800, std::vector<int>(800, 0));
    std::vector<std::vector<int> > parentDir(800, std::vector<int>(800, 0));

    // 8 possible moves in x and y direction
    std::vector<int> moveX { 1, 1, 0, -1, -1, -1, 0, 1 };
    std::vector<int> moveY { 0, 1, 1, 1, 0, -1, -1, -1 };

    nodes start(x_start_, y_start_, 0, 0);
    start.f_cost_ = start.compute_f(x_goal_, y_goal_);
    open_list.push(start);
    open[start.x_][start.y_] = start.f_cost_;

    /**This loop takes the first entry of the open list as the current node
     * since it has the lowest total cost function.*/

    while (!open_list.empty()) {
      nodes current = open_list.top();
      open_list.pop();
      open[current.x_][current.y_] = 0;
      visited[current.x_][current.y_] = 1;

      /** Trace the path and store it of the goal is found.*/

      if (current.x_ == x_goal_ && current.y_ == y_goal_) {
        int p = current.x_, q = current.y_;
        while (!(p == x_start_ && q == y_start_)) {
          int j = parentDir[p][q];
          path.push_back(std::make_pair(p, q));
          p += moveX[j];
          q += moveY[j];
        }
        return path;
      }

      /** Expand all the nodes for current node, calculate their 
       * costs and store them in their variables.*/
      int dir = 0;
      while (dir < 8) {
          int dx = current.x_ + moveX[dir], dy = current.y_ + moveY[dir];
          /** For all the nodes lying outside the map, blocked
           * or is in the visisted list then simply ignor them.*/
        if (!(dx < 0 || dx > 799 || dy < 0 || dy > 799 ||
              map[dx][dy] == 0 || visited[dx][dy] == 1)) {
            nodes child(dx, dy, current.g_cost_, current.f_cost_);
            child.g_cost_ = child.compute_g(dir);
            child.f_cost_ = child.compute_f(x_goal_, y_goal_);
            /* For new nodes, calculate their costs and store them.*/
          if (open[dx][dy] == 0) {
              open[dx][dy] = child.f_cost_;
              open_list.push(child);
              parentDir[dx][dy] = (dir + neighbours / 2) % neighbours;
            /* If the node exists in open list but has more
            * promising total cost then it is replaced by
            * the previous node and it's parent direction is updated.*/
            } else if (open[dx][dy] > child.f_cost_) {
              open[dx][dy] = child.f_cost_;
              parentDir[dx][dy] = (dir + 8 / 2) % 8;
            while (!(open_list.top().x_ == dx && open_list.top().y_ == dy)) {
              temp_list.push(open_list.top());
              open_list.pop();
            }
            open_list.pop();
            while (!temp_list.empty()) {
              open_list.push(temp_list.top());
              temp_list.pop();
            }
            open_list.push(child);
          }
        }
        ++dir;
      }
    }
    std::cout << "Path not found."
              << std::endl;
    path.push_back(std::make_pair(-1, -1));
    return path;
}